

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiKeyChord GetMergedModsFromKeys(void)

{
  bool bVar1;
  ImGuiKeyChord mods;
  undefined4 local_4;
  
  local_4 = 0;
  bVar1 = ImGui::IsKeyDown(ImGuiKey_KeysData_OFFSET);
  if (bVar1) {
    local_4 = 0x1000;
  }
  bVar1 = ImGui::IsKeyDown(ImGuiKey_KeysData_OFFSET);
  if (bVar1) {
    local_4 = local_4 | 0x2000;
  }
  bVar1 = ImGui::IsKeyDown(ImGuiKey_KeysData_OFFSET);
  if (bVar1) {
    local_4 = local_4 | 0x4000;
  }
  bVar1 = ImGui::IsKeyDown(ImGuiKey_KeysData_OFFSET);
  if (bVar1) {
    local_4 = local_4 | 0x8000;
  }
  return local_4;
}

Assistant:

static ImGuiKeyChord GetMergedModsFromKeys()
{
    ImGuiKeyChord mods = 0;
    if (ImGui::IsKeyDown(ImGuiMod_Ctrl))     { mods |= ImGuiMod_Ctrl; }
    if (ImGui::IsKeyDown(ImGuiMod_Shift))    { mods |= ImGuiMod_Shift; }
    if (ImGui::IsKeyDown(ImGuiMod_Alt))      { mods |= ImGuiMod_Alt; }
    if (ImGui::IsKeyDown(ImGuiMod_Super))    { mods |= ImGuiMod_Super; }
    return mods;
}